

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O2

void __thiscall MemoryMappedFile::MemoryMappedFile(MemoryMappedFile *this,MemoryMappedFile *f_other)

{
  (this->mFilename).super_String.mString._M_dataplus._M_p =
       (pointer)&(this->mFilename).super_String.mString.field_2;
  (this->mFilename).super_String.mString._M_string_length = 0;
  (this->mFilename).super_String.mString.field_2._M_local_buf[0] = '\0';
  operator=(this,f_other);
  return;
}

Assistant:

MemoryMappedFile::MemoryMappedFile(MemoryMappedFile&& f_other)
{
    *this = std::move(f_other);
}